

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  nk_plugin_alloc p_Var5;
  uint uVar6;
  uchar *puVar7;
  uchar *puVar8;
  nk_font *pnVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  nk_font_config *pnVar16;
  uchar *puVar17;
  uchar *puVar18;
  ushort *puVar19;
  ushort *puVar20;
  byte bVar21;
  nk_font_config local_88;
  
  bVar21 = 0;
  if ((((compressed_data == (void *)0x0 || atlas == (nk_font_atlas *)0x0) ||
       ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)) ||
      ((atlas->temporary).free == (nk_plugin_free)0x0)) ||
     ((p_Var5 = (atlas->permanent).alloc, p_Var5 == (nk_plugin_alloc)0x0 ||
      ((atlas->permanent).free == (nk_plugin_free)0x0)))) {
    pnVar9 = (nk_font *)0x0;
  }
  else {
    uVar3 = *(uint *)((long)compressed_data + 8);
    uVar6 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8;
    pnVar9 = (nk_font *)0x0;
    puVar8 = (uchar *)(*p_Var5)((atlas->permanent).userdata,(void *)0x0,
                                (ulong)uVar6 | (ulong)(uVar3 << 0x18));
    if (puVar8 != (uchar *)0x0) {
      uVar4 = *compressed_data;
      if (((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) ==
           0x57bc0000) &&
         (uVar4 = *(uint *)((long)compressed_data + 4),
         ((uVar4 >> 0x18 == 0 && (uVar4 & 0xff0000) == 0) && (uVar4 & 0xff00) == 0) &&
         (uVar4 & 0xff) == 0)) {
        uVar4 = *(uint *)((long)compressed_data + 8);
        nk__barrier3 = (uchar *)((compressed_size & 0xffffffff) + (long)compressed_data);
        puVar18 = puVar8;
        puVar19 = (ushort *)((long)compressed_data + 0x10);
        nk__barrier2 = (uchar *)compressed_data;
        nk__barrier = puVar8 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                               uVar4 << 0x18);
        nk__barrier4 = puVar8;
        nk__dout = puVar8;
        do {
          bVar1 = (byte)*puVar19;
          uVar12 = (uint)bVar1;
          if (bVar1 < 0x20) {
            if (bVar1 < 0x18) {
              if (bVar1 < 0x10) {
                if (bVar1 < 8) {
                  if (bVar1 == 4) {
                    uVar11 = puVar19[2] << 8 | puVar19[2] >> 8;
                    nk__dout = puVar18 + (ulong)uVar11 + 1;
                    if (nk__dout <= nk__barrier) {
                      bVar1 = *(byte *)((long)puVar19 + 1);
                      uVar10 = (ulong)(byte)puVar19[1] * 0x100;
                      bVar2 = *(byte *)((long)puVar19 + 3);
                      if (puVar18 + ~((ulong)bVar1 * 0x10000 + (ulong)bVar2 | uVar10) < nk__barrier4
                         ) {
                        nk__dout = nk__barrier + 1;
                      }
                      else {
                        iVar13 = uVar11 + 1;
                        do {
                          nk__dout = puVar18 + 1;
                          *puVar18 = puVar18[~(bVar2 + uVar10) + (ulong)bVar1 * -0x10000];
                          iVar13 = iVar13 + -1;
                          puVar18 = nk__dout;
                        } while (iVar13 != 0);
                      }
                    }
                    puVar20 = puVar19 + 3;
                    puVar18 = nk__dout;
                  }
                  else {
                    if (uVar12 != 6) {
                      if (uVar12 == 7) {
                        nk__lit((byte *)((long)puVar19 + 3),
                                (ushort)(*(ushort *)((long)puVar19 + 1) << 8 |
                                        *(ushort *)((long)puVar19 + 1) >> 8) + 1);
                        uVar10 = (ulong)(ushort)(*(ushort *)((long)puVar19 + 1) << 8 |
                                                *(ushort *)((long)puVar19 + 1) >> 8);
                        lVar14 = 4;
                        goto LAB_00114e03;
                      }
                      break;
                    }
                    nk__dout = puVar18 + (ulong)(byte)puVar19[2] + 1;
                    if (nk__dout <= nk__barrier) {
                      bVar1 = *(byte *)((long)puVar19 + 1);
                      uVar10 = (ulong)(byte)puVar19[1] * 0x100;
                      bVar2 = *(byte *)((long)puVar19 + 3);
                      if (puVar18 + ~((ulong)bVar1 * 0x10000 + (ulong)bVar2 | uVar10) < nk__barrier4
                         ) {
                        nk__dout = nk__barrier + 1;
                      }
                      else {
                        uVar15 = (ulong)(byte)puVar19[2] + 1;
                        do {
                          nk__dout = puVar18 + 1;
                          *puVar18 = puVar18[~(bVar2 + uVar10) + (ulong)bVar1 * -0x10000];
                          uVar12 = (int)uVar15 - 1;
                          uVar15 = (ulong)uVar12;
                          puVar18 = nk__dout;
                        } while (uVar12 != 0);
                      }
                    }
                    puVar20 = (ushort *)((long)puVar19 + 5);
                    puVar18 = nk__dout;
                  }
                }
                else {
                  nk__lit((uchar *)(puVar19 + 1),
                          ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar19 + 1)) - 0x7ff);
                  uVar10 = (ulong)(ushort)(*puVar19 << 8 | *puVar19 >> 8);
                  lVar14 = -0x7fd;
LAB_00114e03:
                  puVar20 = (ushort *)((long)puVar19 + uVar10 + lVar14);
                  puVar18 = nk__dout;
                  if (puVar20 == puVar19) break;
                }
              }
              else {
                uVar11 = *(ushort *)((long)puVar19 + 3) << 8 | *(ushort *)((long)puVar19 + 3) >> 8;
                nk__dout = puVar18 + (ulong)uVar11 + 1;
                if (nk__dout <= nk__barrier) {
                  uVar10 = (ulong)(((uint)*(byte *)((long)puVar19 + 1) * 0x100 +
                                   ((uint)(byte)puVar19[1] | (uint)bVar1 << 0x10)) - 0xfffff);
                  if (puVar18 + -uVar10 < nk__barrier4) {
                    nk__dout = nk__barrier + 1;
                  }
                  else {
                    iVar13 = uVar11 + 1;
                    do {
                      nk__dout = puVar18 + 1;
                      *puVar18 = puVar18[-uVar10];
                      iVar13 = iVar13 + -1;
                      puVar18 = nk__dout;
                    } while (iVar13 != 0);
                  }
                }
                puVar20 = (ushort *)((long)puVar19 + 5);
                puVar18 = nk__dout;
              }
            }
            else {
              nk__dout = puVar18 + (ulong)*(byte *)((long)puVar19 + 3) + 1;
              if (nk__dout <= nk__barrier) {
                uVar10 = (ulong)(((uint)*(byte *)((long)puVar19 + 1) * 0x100 +
                                 ((uint)(byte)puVar19[1] | (uint)bVar1 << 0x10)) - 0x17ffff);
                if (puVar18 + -uVar10 < nk__barrier4) {
                  nk__dout = nk__barrier + 1;
                }
                else {
                  uVar15 = (ulong)*(byte *)((long)puVar19 + 3) + 1;
                  do {
                    nk__dout = puVar18 + 1;
                    *puVar18 = puVar18[-uVar10];
                    uVar12 = (int)uVar15 - 1;
                    uVar15 = (ulong)uVar12;
                    puVar18 = nk__dout;
                  } while (uVar12 != 0);
                }
              }
              puVar20 = puVar19 + 2;
              puVar18 = nk__dout;
            }
          }
          else if ((char)bVar1 < '\0') {
            uVar12 = uVar12 - 0x7f;
            uVar10 = (ulong)uVar12;
            puVar17 = puVar18 + uVar10;
            puVar7 = puVar17;
            if (puVar17 <= nk__barrier) {
              bVar1 = *(byte *)((long)puVar19 + 1);
              puVar17 = puVar18;
              if (puVar18 + ~(ulong)bVar1 < nk__barrier4) {
                puVar17 = nk__barrier + 1;
                puVar7 = puVar17;
              }
              else {
                while (puVar7 = nk__dout, uVar12 != 0) {
                  nk__dout = puVar17 + 1;
                  *puVar17 = puVar17[~(ulong)bVar1];
                  uVar12 = (int)uVar10 - 1;
                  uVar10 = (ulong)uVar12;
                  puVar17 = nk__dout;
                }
              }
            }
            nk__dout = puVar7;
            puVar20 = puVar19 + 1;
            puVar18 = puVar17;
          }
          else {
            if (bVar1 < 0x40) {
              nk__lit((byte *)((long)puVar19 + 1),uVar12 - 0x1f);
              uVar10 = (ulong)(byte)*puVar19;
              lVar14 = -0x1e;
              goto LAB_00114e03;
            }
            nk__dout = puVar18 + (ulong)(byte)puVar19[1] + 1;
            if (nk__dout <= nk__barrier) {
              uVar10 = (ulong)(((uint)*(byte *)((long)puVar19 + 1) + (uint)bVar1 * 0x100) - 0x3fff);
              if (puVar18 + -uVar10 < nk__barrier4) {
                nk__dout = nk__barrier + 1;
              }
              else {
                uVar15 = (ulong)(byte)puVar19[1] + 1;
                do {
                  nk__dout = puVar18 + 1;
                  *puVar18 = puVar18[-uVar10];
                  uVar12 = (int)uVar15 - 1;
                  uVar15 = (ulong)uVar12;
                  puVar18 = nk__dout;
                } while (uVar12 != 0);
              }
            }
            puVar20 = (ushort *)((long)puVar19 + 3);
            puVar18 = nk__dout;
          }
          puVar19 = puVar20;
        } while (puVar18 <=
                 puVar8 + (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                          uVar4 << 0x18));
      }
      if (config == (nk_font_config *)0x0) {
        local_88.merge_mode = '\0';
        local_88.pixel_snap = '\0';
        local_88.next = (nk_font_config *)0x0;
        local_88.padding[2] = '\0';
        local_88.oversample_v = '\x01';
        local_88.oversample_h = '\x03';
        local_88.padding[0] = '\0';
        local_88.padding[1] = '\0';
        local_88.coord_type = NK_COORD_UV;
        local_88.spacing.x = 0.0;
        local_88.spacing.y = 0.0;
        local_88.range = nk_font_default_glyph_ranges::ranges;
        local_88.font = (nk_baked_font *)0x0;
        local_88.fallback_glyph = 0x3f;
        local_88._68_8_ = 0;
        local_88._76_8_ = 0;
        local_88.p._4_4_ = 0;
      }
      else {
        pnVar16 = &local_88;
        for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
          pnVar16->next = config->next;
          config = (nk_font_config *)((long)config + (ulong)bVar21 * -0x10 + 8);
          pnVar16 = (nk_font_config *)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 8);
        }
      }
      local_88.ttf_blob._0_3_ = SUB83(puVar8,0);
      local_88.ttf_blob._3_5_ = (undefined5)((ulong)puVar8 >> 0x18);
      local_88.ttf_size._0_3_ = (undefined3)uVar6;
      local_88.ttf_size._3_5_ = (uint5)(byte)uVar3;
      local_88.ttf_data_owned_by_atlas = '\x01';
      local_88.size = height;
      pnVar9 = nk_font_atlas_add(atlas,&local_88);
    }
  }
  return pnVar9;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
void *compressed_data, nk_size compressed_size, float height,
const struct nk_font_config *config)
{
unsigned int decompressed_size;
void *decompressed_data;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

NK_ASSERT(compressed_data);
NK_ASSERT(compressed_size);
if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
NK_ASSERT(decompressed_data);
if (!decompressed_data) return 0;
nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
(unsigned int)compressed_size);

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = decompressed_data;
cfg.ttf_size = decompressed_size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}